

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::generate_old_swift_struct
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_private)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  reference pptVar6;
  string local_e0;
  string local_c0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_a0;
  t_field **local_98;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_90;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  allocator local_49;
  string local_48 [8];
  string visibility;
  bool is_private_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  pcVar4 = "public";
  if (is_private) {
    pcVar4 = "private";
  }
  visibility.field_2._M_local_buf[0xf] = is_private;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar4,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  t_generator::indent_abi_cxx11_((string *)&members,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&members);
  poVar5 = std::operator<<(poVar5,local_48);
  poVar5 = std::operator<<(poVar5," final class ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator<<(poVar5,(string *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::string::~string((string *)&members);
  uVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])();
  if ((uVar3 & 1) != 0) {
    std::operator<<(out," : ErrorType");
  }
  block_open(this,out);
  m_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_90);
  local_98 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_90._M_current = local_98;
  while( true ) {
    local_a0._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_90,&local_a0);
    if (!bVar1) break;
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_c0,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_c0);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_90);
    declare_property_abi_cxx11_
              (&local_e0,this,*pptVar6,(bool)(visibility.field_2._M_local_buf[0xf] & 1));
    poVar5 = std::operator<<(poVar5,(string *)&local_e0);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_90);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,local_48);
  std::operator<<(poVar5," init()");
  block_open(this,out);
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  bVar1 = struct_has_required_fields(this,tstruct);
  if (bVar1) {
    generate_swift_struct_init
              (this,out,tstruct,false,(bool)(visibility.field_2._M_local_buf[0xf] & 1));
  }
  bVar1 = struct_has_optional_fields(this,tstruct);
  if (bVar1) {
    generate_swift_struct_init
              (this,out,tstruct,true,(bool)(visibility.field_2._M_local_buf[0xf] & 1));
  }
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void t_swift_generator::generate_old_swift_struct(ostream& out,
                                                  t_struct* tstruct,
                                                  bool is_private) {
  string visibility = is_private ? "private" : "public";

  out << indent() << visibility << " final class " << tstruct->get_name();

  if (tstruct->is_xception()) {
    out << " : ErrorType";
  }

  block_open(out);

  // properties
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    out << endl;
    out << indent() << declare_property(*m_iter, is_private) << endl;
  }

  out << endl;

  // init

  indent(out) << visibility << " init()";
  block_open(out);
  block_close(out);

  out << endl;

  if (struct_has_required_fields(tstruct)) {
    generate_swift_struct_init(out, tstruct, false, is_private);
  }
  if (struct_has_optional_fields(tstruct)) {
    generate_swift_struct_init(out, tstruct, true, is_private);
  }

  block_close(out);

  out << endl;
}